

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O3

bool parse_float(uint8_t *buf,ParsedJson *pj,uint32_t offset,bool found_minus)

{
  byte *pbVar1;
  uint64_t *puVar2;
  long lVar3;
  byte *pbVar4;
  undefined7 in_register_00000009;
  byte bVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  
  uVar7 = CONCAT71(in_register_00000009,found_minus) & 0xffffffff;
  lVar3 = uVar7 + offset;
  if (buf[uVar7 + offset] == '0') {
    bVar5 = buf[lVar3 + 1];
    pbVar4 = buf + lVar3 + 1;
    dVar15 = 0.0;
  }
  else {
    dVar15 = (double)(byte)(buf[uVar7 + offset] - 0x30);
    pbVar4 = buf + lVar3 + 1;
    bVar5 = buf[lVar3 + 1];
    while ((byte)(bVar5 - 0x30) < 10) {
      dVar15 = dVar15 * 10.0 + (double)(int)(char)(bVar5 - 0x30);
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      bVar5 = *pbVar1;
    }
  }
  if (bVar5 == 0x2e) {
    if (9 < (byte)(pbVar4[1] - 0x30)) {
      return false;
    }
    dVar15 = (double)(int)(char)(pbVar4[1] - 0x30) * 0.1 + dVar15;
    bVar5 = pbVar4[2];
    pbVar4 = pbVar4 + 2;
    bVar8 = bVar5 - 0x30;
    if (bVar8 < 10) {
      dVar16 = 0.1;
      do {
        dVar16 = dVar16 * 0.1;
        dVar15 = (double)(int)(char)bVar8 * dVar16 + dVar15;
        bVar5 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
        bVar8 = bVar5 - 0x30;
      } while (bVar8 < 10);
    }
  }
  if ((bVar5 | 0x20) == 0x65) {
    pbVar1 = pbVar4 + 1;
    bVar14 = (*pbVar1 - 0x2b & 0xfd) == 0;
    pbVar6 = pbVar4 + 1;
    if (bVar14) {
      pbVar6 = pbVar4 + 2;
    }
    bVar8 = pbVar4[(ulong)bVar14 + 1] - 0x30;
    if (9 < bVar8) {
      return false;
    }
    bVar10 = pbVar6[1] - 0x30;
    pbVar4 = pbVar6 + 2;
    if (9 < bVar10) {
      pbVar4 = pbVar6 + 1;
    }
    bVar12 = pbVar6[(ulong)(bVar10 < 10) + 1] - 0x30;
    bVar13 = pbVar4[bVar12 < 10] - 0x30;
    pbVar4 = pbVar4 + (ulong)(bVar13 < 10) + (ulong)(bVar12 < 10);
    bVar5 = *pbVar4;
    if ((byte)(bVar5 - 0x30) < 10) {
      return false;
    }
    uVar11 = (uint)bVar10 + (uint)bVar8 * 10;
    if (9 < bVar10) {
      uVar11 = (uint)bVar8;
    }
    uVar9 = (uint)bVar12 + uVar11 * 10;
    if (9 < bVar12) {
      uVar9 = uVar11;
    }
    uVar11 = (uint)bVar13 + uVar9 * 10;
    if (9 < bVar13) {
      uVar11 = uVar9;
    }
    uVar9 = -uVar11;
    if (*pbVar1 != 0x2d) {
      uVar9 = uVar11;
    }
    if (0x268 < uVar9 + 0x134) {
      return false;
    }
    dVar15 = dVar15 * power_of_ten[uVar9 + 0x134];
  }
  if (structural_or_whitespace_negated[bVar5] != 0) {
    return false;
  }
  if (found_minus) {
    dVar15 = -dVar15;
  }
  puVar2 = pj->tape;
  uVar11 = pj->current_loc;
  puVar2[uVar11] = 0x6400000000000000;
  pj->current_loc = uVar11 + 2;
  puVar2[uVar11 + 1] = (uint64_t)dVar15;
  return structural_or_whitespace[*pbVar4] != 0;
}

Assistant:

static never_inline bool
parse_float(const uint8_t *const buf,
                          ParsedJson &pj, const uint32_t offset,
                          bool found_minus) {
  const char *p = reinterpret_cast<const char *>(buf + offset);
  bool negative = false;
  if (found_minus) {
    ++p;
    negative = true;
  }
  double i;
  if (*p == '0') { // 0 cannot be followed by an integer
    ++p;
    i = 0;
  } else {
    unsigned char digit = *p - '0';
    i = digit;
    p++;
    while (is_integer(*p)) {
      digit = *p - '0';
      i = 10 * i + digit;
      ++p;
    }
  }
  if ('.' == *p) {
    ++p;
    double fractionalweight = 1;
    if(is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    } else {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    while (is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    }
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool negexp = false;
    if ('-' == *p) {
      negexp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    if (!is_integer(*p)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    unsigned char digit = *p - '0';
    int64_t expnumber = digit; // exponential part
    p++;
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    int exponent = (negexp ? -expnumber : expnumber);
    if ((exponent > 308) || (exponent < -308)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    i *= power_of_ten[308 + exponent];
  }
  if(is_not_structural_or_whitespace(*p)) {
    return false;
  }
  double d = negative ? -i : i;
  pj.write_tape_double(d);
#ifdef JSON_TEST_NUMBERS // for unit testing
  foundFloat(d, buf + offset);
#endif
  return is_structural_or_whitespace(*p);
}